

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O0

BitMatrix *
ZXing::Pdf417::BitMatrixFromBitArray
          (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           *input,int margin)

{
  const_reference cVar1;
  int height_00;
  int iVar2;
  int in_EDX;
  BitMatrix *in_RSI;
  BitMatrix *in_RDI;
  int x;
  int yOutput;
  int y;
  int height;
  int width;
  BitMatrix *result;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  BitMatrix *this;
  int iVar3;
  undefined4 in_stack_ffffffffffffffcc;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  
  this = in_RDI;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                *)in_RSI,0);
  height_00 = Size<std::vector<bool,std::allocator<bool>>>
                        ((vector<bool,_std::allocator<bool>_> *)this);
  iVar2 = Size<std::vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>>
                    ((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      *)this);
  BitMatrix::BitMatrix(in_RSI,in_EDX,height_00);
  local_24 = 0;
  BitMatrix::height(in_RDI);
  for (; local_24 < iVar2; local_24 = local_24 + 1) {
    for (iVar3 = 0; iVar3 < height_00; iVar3 = iVar3 + 1) {
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    *)in_RSI,(long)local_24);
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,iVar3));
      in_stack_ffffffffffffffac = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffac);
      if (cVar1) {
        BitMatrix::set(this,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,false);
      }
    }
  }
  return this;
}

Assistant:

static BitMatrix BitMatrixFromBitArray(const std::vector<std::vector<bool>>& input, int margin)
{
	// Creates the bitmatrix with extra space for whitespace
	int width = Size(input[0]);
	int height = Size(input);
	BitMatrix result(width + 2 * margin, height + 2 * margin);
	for (int y = 0, yOutput = static_cast<int>(result.height()) - margin - 1; y < height; y++, yOutput--) {
		for (int x = 0; x < width; ++x) {
			// Zero is white in the bytematrix
			if (input[y][x]) {
				result.set(x + margin, yOutput);
			}
		}
	}
	return result;
}